

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Lms_ObjAreaMark_rec(Gia_Obj_t *pObj)

{
  ulong uVar1;
  
  while( true ) {
    uVar1 = *(ulong *)pObj;
    if ((((uint)uVar1 >> 0x1e & 1) != 0) || (((uint)uVar1 & 0x9fffffff) == 0x9fffffff)) break;
    *(ulong *)pObj = uVar1 | 0x40000000;
    Lms_ObjAreaMark_rec(pObj + -(uVar1 & 0x1fffffff));
    pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  return;
}

Assistant:

void Lms_ObjAreaMark_rec( Gia_Obj_t * pObj )
{
    if ( pObj->fMark0 || Gia_ObjIsCi(pObj) )
        return;
    pObj->fMark0 = 1;
    Lms_ObjAreaMark_rec( Gia_ObjFanin0(pObj) );
    Lms_ObjAreaMark_rec( Gia_ObjFanin1(pObj) );
}